

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_24345a::ValueSetter::handleToken(ValueSetter *this,Token *token)

{
  token_type_e tVar1;
  bool bVar2;
  string value;
  allocator<char> local_61;
  string local_60;
  string local_40 [32];
  
  tVar1 = token->type;
  std::__cxx11::string::string(local_40,(string *)&token->value);
  switch(this->state) {
  case st_top:
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"BMC",&local_61);
    bVar2 = QPDFTokenizer::Token::isWord(token,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar2) {
      this->state = st_bmc;
    }
    break;
  case st_bmc:
    if (tVar1 - tt_space < 2) {
      QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    }
    else {
      this->state = st_emc;
    }
  case st_emc:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"EMC",&local_61);
    bVar2 = QPDFTokenizer::Token::isWord(token,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar2) {
      this->state = st_end;
      writeAppearance(this);
    }
    break;
  case st_end:
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void
ValueSetter::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e ttype = token.getType();
    std::string value = token.getValue();
    bool do_replace = false;
    switch (state) {
    case st_top:
        writeToken(token);
        if (token.isWord("BMC")) {
            state = st_bmc;
        }
        break;

    case st_bmc:
        if ((ttype == QPDFTokenizer::tt_space) || (ttype == QPDFTokenizer::tt_comment)) {
            writeToken(token);
        } else {
            state = st_emc;
        }
        // fall through to emc

    case st_emc:
        if (token.isWord("EMC")) {
            do_replace = true;
            state = st_end;
        }
        break;

    case st_end:
        writeToken(token);
        break;
    }
    if (do_replace) {
        writeAppearance();
    }
}